

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O0

_Bool xdr_naccepted_reply(XDR *xdrs,accepted_reply *ar)

{
  _Bool _Var1;
  uint uVar2;
  accepted_reply *ar_local;
  XDR *xdrs_local;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x4e,"_Bool xdr_naccepted_reply(XDR *, struct accepted_reply *)");
  }
  if (ar != (accepted_reply *)0x0) {
    uVar2 = xdr_opaque_auth((XDR *)xdrs,(opaque_auth *)&ar->ar_verf);
    if ((uVar2 & 1) == 0) {
      xdrs_local._7_1_ = false;
    }
    else {
      uVar2 = xdr_enum((XDR *)xdrs,(enum_t *)ar);
      if ((uVar2 & 1) == 0) {
        xdrs_local._7_1_ = false;
      }
      else {
        switch(ar->ar_stat) {
        case SUCCESS:
          xdrs_local._7_1_ = (*(ar->ru).AR_results.proc)(xdrs,(ar->ru).AR_results.where);
          break;
        case PROG_UNAVAIL:
        case PROC_UNAVAIL:
        case GARBAGE_ARGS:
        case SYSTEM_ERR:
        default:
          xdrs_local._7_1_ = true;
          break;
        case PROG_MISMATCH:
          _Var1 = xdr_u_int32_t(xdrs,(u_int32_t *)&ar->ru);
          if (_Var1) {
            xdrs_local._7_1_ = xdr_u_int32_t(xdrs,&(ar->ru).AR_versions.high);
          }
          else {
            xdrs_local._7_1_ = false;
          }
        }
      }
    }
    return xdrs_local._7_1_;
  }
  __assert_fail("ar != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                ,0x4f,"_Bool xdr_naccepted_reply(XDR *, struct accepted_reply *)");
}

Assistant:

bool
xdr_naccepted_reply(XDR *xdrs, struct accepted_reply *ar)
{
	assert(xdrs != NULL);
	assert(ar != NULL);

	/* personalized union, rather than calling xdr_union */
	if (!xdr_opaque_auth(xdrs, &(ar->ar_verf)))
		return (false);
	if (!inline_xdr_enum(xdrs, (enum_t *) &(ar->ar_stat)))
		return (false);
	switch (ar->ar_stat) {

	case SUCCESS:
		return ((*(ar->ar_results.proc)) (xdrs, ar->ar_results.where));

	case PROG_MISMATCH:
		if (!inline_xdr_u_int32_t(xdrs, &(ar->ar_vers.low)))
			return (false);
		return (inline_xdr_u_int32_t(xdrs, &(ar->ar_vers.high)));

	case GARBAGE_ARGS:
	case SYSTEM_ERR:
	case PROC_UNAVAIL:
	case PROG_UNAVAIL:
		break;
	}
	return (true);		/* true => open ended set of problems */
}